

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  pvVar1 = &(this->super_IfcStructuralAction).field_0x158 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x158) = 0x8deb30;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0x8dec20;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8deb58;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x8deb80;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x8deba8;
  *(undefined8 *)((long)pvVar1 + -0x58) = 0x8debd0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8debf8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)
             (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
               super_IfcObject.field_0x0 + lVar2),&PTR_construction_vtable_24__008de9a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}